

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

void __thiscall crnlib::dxt3_block::set_alpha(dxt3_block *this,uint x,uint y,uint value,bool scaled)

{
  byte bVar1;
  uint uVar2;
  undefined7 in_register_00000081;
  
  if ((int)CONCAT71(in_register_00000081,scaled) != 0) {
    value = (value * 0xf + 0x80) / 0xff;
  }
  uVar2 = (x >> 1) + y * 2;
  bVar1 = (byte)(x << 2) & 4;
  this->m_alpha[uVar2] = (byte)(value << bVar1) | ~(byte)(0xf << bVar1) & this->m_alpha[uVar2];
  return;
}

Assistant:

void dxt3_block::set_alpha(uint x, uint y, uint value, bool scaled)
    {
        CRNLIB_ASSERT((x < cDXTBlockSize) && (y < cDXTBlockSize));

        if (scaled)
        {
            CRNLIB_ASSERT(value <= 0xFF);
            value = (value * 15U + 128U) / 255U;
        }
        else
        {
            CRNLIB_ASSERT(value <= 0xF);
        }

        uint ofs = (y << 1U) + (x >> 1U);
        uint c = m_alpha[ofs];

        c &= ~(0xF << ((x & 1U) << 2U));
        c |= (value << ((x & 1U) << 2U));

        m_alpha[ofs] = static_cast<uint8>(c);
    }